

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer_scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall
wallet::ExternalSignerScriptPubKeyMan::SetupDescriptor
          (ExternalSignerScriptPubKeyMan *this,WalletBatch *batch,
          unique_ptr<Descriptor,_std::default_delete<Descriptor>_> desc)

{
  WalletDescriptor *descriptor;
  WalletStorage *pWVar1;
  bool bVar2;
  int iVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long in_FS_OFFSET;
  shared_ptr<Descriptor> descriptor_00;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  WalletDescriptor w_desc;
  int32_t in_stack_fffffffffffffe78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_180;
  unique_lock<std::recursive_mutex> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  uint256 local_148;
  WalletDescriptor local_128;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_178._M_device = &(this->super_DescriptorScriptPubKeyMan).cs_desc_man.super_recursive_mutex;
  local_178._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_178);
  pWVar1 = (this->super_DescriptorScriptPubKeyMan).super_ScriptPubKeyMan.m_storage;
  iVar3 = (*pWVar1->_vptr_WalletStorage[4])(pWVar1,0x400000000);
  if ((char)iVar3 == '\0') {
    __assert_fail("m_storage.IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/external_signer_scriptpubkeyman.cpp"
                  ,0x1b,
                  "bool wallet::ExternalSignerScriptPubKeyMan::SetupDescriptor(WalletBatch &, std::unique_ptr<Descriptor>)"
                 );
  }
  pWVar1 = (this->super_DescriptorScriptPubKeyMan).super_ScriptPubKeyMan.m_storage;
  iVar3 = (*pWVar1->_vptr_WalletStorage[4])(pWVar1,0x800000000);
  if ((char)iVar3 != '\0') {
    _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)GetTime();
    std::__shared_ptr<Descriptor,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Descriptor,std::default_delete<Descriptor>,void>
              ((__shared_ptr<Descriptor,(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffe78,
               (unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
               desc._M_t.super___uniq_ptr_impl<Descriptor,_std::default_delete<Descriptor>_>._M_t.
               super__Tuple_impl<0UL,_Descriptor_*,_std::default_delete<Descriptor>_>.
               super__Head_base<0UL,_Descriptor_*,_false>._M_head_impl);
    descriptor_00.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var4._M_pi;
    descriptor_00.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&stack0xfffffffffffffe78;
    WalletDescriptor::WalletDescriptor(&local_128,descriptor_00,0,0,0,in_stack_fffffffffffffe78);
    if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180);
    }
    descriptor = &(this->super_DescriptorScriptPubKeyMan).m_wallet_descriptor;
    (this->super_DescriptorScriptPubKeyMan).m_wallet_descriptor.descriptor.
    super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_128.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->super_DescriptorScriptPubKeyMan).m_wallet_descriptor.descriptor.
                super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_128.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    *(undefined4 *)
     (this->super_DescriptorScriptPubKeyMan).m_wallet_descriptor.id.super_base_blob<256U>.m_data.
     _M_elems = local_128.id.super_base_blob<256U>.m_data._M_elems._0_4_;
    *(undefined4 *)
     ((this->super_DescriptorScriptPubKeyMan).m_wallet_descriptor.id.super_base_blob<256U>.m_data.
      _M_elems + 4) = local_128.id.super_base_blob<256U>.m_data._M_elems._4_4_;
    *(undefined4 *)
     ((this->super_DescriptorScriptPubKeyMan).m_wallet_descriptor.id.super_base_blob<256U>.m_data.
      _M_elems + 8) = local_128.id.super_base_blob<256U>.m_data._M_elems._8_4_;
    *(undefined4 *)
     ((this->super_DescriptorScriptPubKeyMan).m_wallet_descriptor.id.super_base_blob<256U>.m_data.
      _M_elems + 0xc) = local_128.id.super_base_blob<256U>.m_data._M_elems._12_4_;
    *(undefined8 *)
     ((this->super_DescriptorScriptPubKeyMan).m_wallet_descriptor.id.super_base_blob<256U>.m_data.
      _M_elems + 0x10) = local_128.id.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)
     ((this->super_DescriptorScriptPubKeyMan).m_wallet_descriptor.id.super_base_blob<256U>.m_data.
      _M_elems + 0x18) = local_128.id.super_base_blob<256U>.m_data._M_elems._24_8_;
    (this->super_DescriptorScriptPubKeyMan).m_wallet_descriptor.creation_time =
         local_128.creation_time;
    (this->super_DescriptorScriptPubKeyMan).m_wallet_descriptor.range_start = local_128.range_start;
    (this->super_DescriptorScriptPubKeyMan).m_wallet_descriptor.range_end = local_128.range_end;
    (this->super_DescriptorScriptPubKeyMan).m_wallet_descriptor.next_index = local_128.next_index;
    if (&local_128 != descriptor) {
      std::
      _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::unordered_map<unsigned_int,CExtPubKey,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>>>,std::allocator<std::pair<unsigned_int_const,std::unordered_map<unsigned_int,CExtPubKey,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::unordered_map<unsigned_int,CExtPubKey,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>>>,std::allocator<std::pair<unsigned_int_const,std::unordered_map<unsigned_int,CExtPubKey,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
                ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::unordered_map<unsigned_int,CExtPubKey,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>>>,std::allocator<std::pair<unsigned_int_const,std::unordered_map<unsigned_int,CExtPubKey,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&(this->super_DescriptorScriptPubKeyMan).m_wallet_descriptor.cache,
                 (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)&local_128.cache);
      std::
      _Hashtable<unsigned_int,std::pair<unsigned_int_const,CExtPubKey>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,CExtPubKey>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
                ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,CExtPubKey>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&(this->super_DescriptorScriptPubKeyMan).m_wallet_descriptor.cache.
                     m_parent_xpubs,&local_128.cache.m_parent_xpubs._M_h);
      std::
      _Hashtable<unsigned_int,std::pair<unsigned_int_const,CExtPubKey>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,CExtPubKey>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
                ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,CExtPubKey>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&(this->super_DescriptorScriptPubKeyMan).m_wallet_descriptor.cache.
                     m_last_hardened_xpubs,&local_128.cache.m_last_hardened_xpubs._M_h);
    }
    (*(this->super_DescriptorScriptPubKeyMan).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1a])
              (&local_148,this);
    bVar2 = WalletBatch::WriteDescriptor(batch,&local_148,descriptor);
    if (bVar2) {
      DescriptorScriptPubKeyMan::TopUpWithDB(&this->super_DescriptorScriptPubKeyMan,batch,0);
      pWVar1 = (this->super_DescriptorScriptPubKeyMan).super_ScriptPubKeyMan.m_storage;
      (*pWVar1->_vptr_WalletStorage[5])(pWVar1,batch);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_128.cache.m_last_hardened_xpubs._M_h);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_128.cache.m_parent_xpubs._M_h);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&local_128.cache);
      if (local_128.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_128.descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_178);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return true;
      }
    }
    else {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"SetupDescriptor","");
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_168,": writing descriptor failed");
      local_148.super_base_blob<256U>.m_data._M_elems._0_8_ = (pbVar5->_M_dataplus)._M_p;
      paVar6 = &pbVar5->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148.super_base_blob<256U>.m_data._M_elems._0_8_ == paVar6) {
        local_148.super_base_blob<256U>.m_data._M_elems._16_8_ = paVar6->_M_allocated_capacity;
        local_148.super_base_blob<256U>.m_data._M_elems._24_8_ =
             *(undefined8 *)((long)&pbVar5->field_2 + 8);
        local_148.super_base_blob<256U>.m_data._M_elems._0_8_ =
             local_148.super_base_blob<256U>.m_data._M_elems + 0x10;
      }
      else {
        local_148.super_base_blob<256U>.m_data._M_elems._16_8_ = paVar6->_M_allocated_capacity;
      }
      local_148.super_base_blob<256U>.m_data._M_elems._8_8_ = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar5->_M_string_length = 0;
      (pbVar5->field_2)._M_local_buf[0] = '\0';
      std::runtime_error::runtime_error(this_00,(string *)&local_148);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    __stack_chk_fail();
  }
  __assert_fail("m_storage.IsWalletFlagSet(WALLET_FLAG_EXTERNAL_SIGNER)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/external_signer_scriptpubkeyman.cpp"
                ,0x1c,
                "bool wallet::ExternalSignerScriptPubKeyMan::SetupDescriptor(WalletBatch &, std::unique_ptr<Descriptor>)"
               );
}

Assistant:

bool ExternalSignerScriptPubKeyMan::SetupDescriptor(WalletBatch& batch, std::unique_ptr<Descriptor> desc)
{
    LOCK(cs_desc_man);
    assert(m_storage.IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS));
    assert(m_storage.IsWalletFlagSet(WALLET_FLAG_EXTERNAL_SIGNER));

    int64_t creation_time = GetTime();

    // Make the descriptor
    WalletDescriptor w_desc(std::move(desc), creation_time, 0, 0, 0);
    m_wallet_descriptor = w_desc;

    // Store the descriptor
    if (!batch.WriteDescriptor(GetID(), m_wallet_descriptor)) {
        throw std::runtime_error(std::string(__func__) + ": writing descriptor failed");
    }

    // TopUp
    TopUpWithDB(batch);

    m_storage.UnsetBlankWalletFlag(batch);
    return true;
}